

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

anon_class_264_17_dd0fa161 * __thiscall
qclab::qgates::lambda_QGate2<std::complex<double>>
          (anon_class_264_17_dd0fa161 *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<double>_> *mat2,complex<double> *vector)

{
  complex<double> *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<double>_> *A;
  
  A = (SquareMatrix<std::complex<double>_> *)CONCAT71(in_register_00000011,op);
  if (A->size_ == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>((Op)this,A);
    pcVar1 = (A->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    uVar3 = *(undefined8 *)(pcVar1->_M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m11)._M_value = *(undefined8 *)pcVar1->_M_value;
    *(undefined8 *)((__return_storage_ptr__->m11)._M_value + 8) = uVar3;
    lVar2 = A->size_;
    uVar3 = *(undefined8 *)(pcVar1[lVar2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m12)._M_value = *(undefined8 *)pcVar1[lVar2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m12)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[lVar2 * 2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m13)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m13)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[lVar2 * 3]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m14)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 3]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m14)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m21)._M_value = *(undefined8 *)pcVar1[1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m21)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 + 1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m22)._M_value =
         *(undefined8 *)pcVar1[lVar2 + 1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m22)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 2 + 1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m23)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 2 + 1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m23)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 3 + 1]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m24)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 3 + 1]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m24)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m31)._M_value = *(undefined8 *)pcVar1[2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m31)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 + 2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m32)._M_value =
         *(undefined8 *)pcVar1[lVar2 + 2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m32)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 2 + 2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m33)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 2 + 2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m33)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 3 + 2]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m34)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 3 + 2]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m34)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)(pcVar1[3]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m41)._M_value = *(undefined8 *)pcVar1[3]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m41)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 + 3]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m42)._M_value =
         *(undefined8 *)pcVar1[lVar2 + 3]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m42)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 2 + 3]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m43)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 2 + 3]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m43)._M_value + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)pcVar1[lVar2 * 3 + 3]._M_value + 8);
    *(undefined8 *)(__return_storage_ptr__->m44)._M_value =
         *(undefined8 *)pcVar1[lVar2 * 3 + 3]._M_value;
    *(undefined8 *)((__return_storage_ptr__->m44)._M_value + 8) = uVar3;
    __return_storage_ptr__->vector = (complex<double> *)mat2;
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<double>]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }